

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintestlogger.cpp
# Opt level: O0

void __thiscall
QPlainTestLogger::printBenchmarkResultsHeader(QPlainTestLogger *this,QBenchmarkResult *result)

{
  bool bVar1;
  char *pcVar2;
  long in_FS_OFFSET;
  QByteArray gtag;
  QByteArray tag;
  FixedBufString<1022> buf;
  QString *in_stack_fffffffffffffb18;
  QByteArray *in_stack_fffffffffffffb20;
  char *in_stack_fffffffffffffb28;
  FixedBufString<1022> *in_stack_fffffffffffffb30;
  char *in_stack_fffffffffffffb38;
  FixedBufString<1022> *pFVar3;
  FixedBufString<1022> *in_stack_fffffffffffffb40;
  QByteArray local_468;
  QByteArray local_448 [2];
  undefined1 local_410 [1032];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_410,0xaa,0x408);
  anon_unknown.dwarf_9d58f::FixedBufString<1022>::FixedBufString((FixedBufString<1022> *)0x12f7c6);
  QTest::benchmarkResult2String();
  QTestResult::currentTestObjectName();
  QString::toLatin1(in_stack_fffffffffffffb18);
  QByteArray::data(in_stack_fffffffffffffb20);
  (anonymous_namespace)::FixedBufString<1022>::appendf<char_const*,char_const*,char*>
            (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30,
             in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20);
  QByteArray::~QByteArray((QByteArray *)0x12f834);
  pFVar3 = (FixedBufString<1022> *)&DAT_aaaaaaaaaaaaaaaa;
  local_448[0].d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_448[0].d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_448[0].d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  pcVar2 = QTestResult::currentDataTag();
  QByteArray::QByteArray(local_448,pcVar2,-1);
  local_468.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_468.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_468.d.size = (qsizetype)pFVar3;
  pcVar2 = QTestResult::currentGlobalDataTag();
  QByteArray::QByteArray(&local_468,pcVar2,-1);
  bVar1 = QByteArray::isEmpty((QByteArray *)0x12f8c6);
  if ((bVar1) || (bVar1 = QByteArray::isEmpty((QByteArray *)0x12f8db), bVar1)) {
    bVar1 = QByteArray::isEmpty((QByteArray *)0x12f991);
    if (bVar1) {
      bVar1 = QByteArray::isEmpty((QByteArray *)0x12f9ca);
      if (bVar1) {
        anon_unknown.dwarf_9d58f::FixedBufString<1022>::append
                  (pFVar3,(char *)in_stack_fffffffffffffb30);
      }
      else {
        QByteArray::constData((QByteArray *)0x12f9db);
        (anonymous_namespace)::FixedBufString<1022>::appendf<char_const*>
                  (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                   (char *)in_stack_fffffffffffffb20);
      }
    }
    else {
      QByteArray::constData((QByteArray *)0x12f9a2);
      (anonymous_namespace)::FixedBufString<1022>::appendf<char_const*>
                (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                 (char *)in_stack_fffffffffffffb20);
    }
  }
  else {
    pFVar3 = (FixedBufString<1022> *)QByteArray::constData((QByteArray *)0x12f8f0);
    QByteArray::constData((QByteArray *)0x12f902);
    (anonymous_namespace)::FixedBufString<1022>::appendf<char_const*,char_const*>
              (pFVar3,in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20,
               (char *)in_stack_fffffffffffffb18);
  }
  (anonymous_namespace)::FixedBufString::operator_cast_to_char_((FixedBufString<1022> *)0x12fa1f);
  outputMessage((QPlainTestLogger *)in_stack_fffffffffffffb20,(char *)in_stack_fffffffffffffb18);
  QByteArray::~QByteArray((QByteArray *)0x12fa44);
  QByteArray::~QByteArray((QByteArray *)0x12fa51);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPlainTestLogger::printBenchmarkResultsHeader(const QBenchmarkResult &result)
{
    FixedBufString<1022> buf;
    buf.appendf("%s: %s::%s", QTest::benchmarkResult2String(),
                QTestResult::currentTestObjectName(), result.context.slotName.toLatin1().data());

    QByteArray tag = QTestResult::currentDataTag();
    QByteArray gtag = QTestResult::currentGlobalDataTag();

    if (!gtag.isEmpty() && !tag.isEmpty())
        buf.appendf(":\"%s:%s\":\n", gtag.constData(), tag.constData());
    else if (!gtag.isEmpty())
        buf.appendf(":\"%s\":\n", gtag.constData());
    else if (!tag.isEmpty())
        buf.appendf(":\"%s\":\n", tag.constData());
    else
        buf.append(":\n");
    outputMessage(buf);
}